

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O3

bool dg::pta::PointerAnalysisFSInv::handleInvalidateLocals(PSNode *node,PSNode *pred)

{
  long lVar1;
  MemoryMapT *mm;
  PSNode *target;
  _Base_ptr p_Var2;
  ulong uVar3;
  bool bVar4;
  MemoryObject *pMVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr *pp_Var7;
  mapped_type *this;
  long lVar8;
  _Rb_tree_node_base *p_Var9;
  byte bVar10;
  long lVar11;
  Pointer *ptr;
  bool bVar12;
  const_iterator __begin4;
  const_iterator local_68;
  Pointer local_50;
  Pointer local_40;
  
  lVar1 = *(long *)(pred + 0x10);
  if (lVar1 != 0) {
    p_Var9 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
    if (p_Var9 != (_Rb_tree_node_base *)(lVar1 + 8)) {
      mm = *(MemoryMapT **)(node + 0x10);
      bVar12 = false;
      do {
        target = *(PSNode **)(p_Var9 + 1);
        if (((INVALIDATED != target) && (UNKNOWN_MEMORY != target)) && (NULLPTR != target)) {
          pMVar5 = getOrCreateMO(mm,target);
          p_Var2 = p_Var9[1]._M_parent;
          for (p_Var6 = (pMVar5->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var6 != &(pMVar5->pointsTo)._M_t._M_impl.super__Rb_tree_header;
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
            bVar4 = containsRemovableLocals(node,(PointsToSetT *)&p_Var6[1]._M_parent);
            if (bVar4) {
              replaceLocalsWithInv(node,(PointsToSetT *)&p_Var6[1]._M_parent);
              bVar12 = true;
            }
          }
          p_Var6 = *(_Rb_tree_node_base **)(p_Var2 + 1);
          pp_Var7 = &p_Var2->_M_left;
          if (p_Var6 != (_Rb_tree_node_base *)pp_Var7) {
            do {
              if (*(long *)(p_Var6 + 2) != 0) {
                this = std::
                       map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                       ::operator[](&pMVar5->pointsTo,(key_type *)(p_Var6 + 1));
                local_68.container_it.
                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                         p_Var6[1]._M_right;
                local_68.container_end.
                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                         (__node_type *)0x0;
                local_68.pos = 0;
                if (*(long *)(p_Var6 + 2) != 0) {
                  p_Var2 = *(_Base_ptr *)
                            ((long)&(((__node_type *)
                                     local_68.container_it.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                     ._M_cur)->
                                    super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                    ._M_storage._M_storage + 8);
                  local_68.pos = 0;
                  uVar3 = (ulong)p_Var2 & 1;
                  while (uVar3 == 0) {
                    if (local_68.pos == 0x3f) {
                      local_68.pos = 0x40;
                      break;
                    }
                    bVar10 = (byte)local_68.pos;
                    local_68.pos = local_68.pos + 1;
                    uVar3 = (ulong)p_Var2 >> (bVar10 & 0x3f) & 2;
                  }
                }
                if ((local_68.pos != 0) ||
                   (local_68.container_it.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                    _M_cur != (__node_type *)0x0)) {
                  do {
                    lVar11 = local_68.pos * 0x10 + __M_assign;
                    lVar8 = (long)*(_Base_ptr *)
                                   ((long)local_68.container_it.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                          ._M_cur + 8) * 0x10;
                    local_50.target = *(PSNode **)(lVar8 + -0x10 + lVar11);
                    local_50.offset.offset = *(type *)(lVar8 + -8 + lVar11);
                    if ((((local_50.target == (PSNode *)0x0) ||
                         ((*(int *)(local_50.target + 0x90) != 1 ||
                          (local_50.target[0xe9] != (PSNode)0x0)))) ||
                        (local_50.target[0xea] != (PSNode)0x0)) ||
                       ((*(long *)(local_50.target + 0xa0) != *(long *)(node + 0xa0) ||
                        (bVar4 = PointerAnalysisFS::isOnLoop(local_50.target), bVar4)))) {
                      ptr = &local_50;
                    }
                    else {
                      local_40.target = INVALIDATED;
                      local_40.offset.offset = 0;
                      ptr = &local_40;
                    }
                    bVar4 = PointerIdPointsToSet::add(this,ptr);
                    bVar12 = (bool)(bVar12 | bVar4);
                    ADT::
                    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                    ::const_iterator::operator++(&local_68);
                  } while (local_68.container_it.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                           ._M_cur != (__node_type *)0x0 || local_68.pos != 0);
                }
              }
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            } while (p_Var6 != (_Rb_tree_node_base *)pp_Var7);
          }
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        if (p_Var9 == (_Rb_tree_node_base *)(lVar1 + 8)) {
          return bVar12;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static bool handleInvalidateLocals(PSNode *node, PSNode *pred) {
        MemoryMapT *pmm = pred->getData<MemoryMapT>();
        if (!pmm) {
            // predecessor was not processed yet
            return false;
        }

        MemoryMapT *mm = node->getData<MemoryMapT>();
        assert(mm && "Node does not have a memory map");

        bool changed = false;
        for (auto &I : *pmm) {
            if (isInvalidTarget(I.first))
                continue;

            // get or create a memory object for this target

            MemoryObject *mo = getOrCreateMO(mm, I.first);
            MemoryObject *pmo = I.second.get();

            for (auto &it : *mo) {
                // remove pointers to locals from the points-to set
                if (containsRemovableLocals(node, it.second)) {
                    replaceLocalsWithInv(node, it.second);
                    assert(!containsRemovableLocals(node, it.second));
                    changed = true;
                }
            }

            for (auto &it : *pmo) {
                PointsToSetT &predS = it.second;
                if (predS.empty())
                    continue;

                PointsToSetT &S = mo->pointsTo[it.first];

                // merge pointers from the previous states
                // but do not include the pointers
                // that _must_ point to destroyed memory
                for (const auto &ptr : predS) {
                    PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target);
                    if (alloc && isLocal(alloc, node) && knownInstance(alloc)) {
                        changed |= S.add(INVALIDATED, 0);
                    } else
                        changed |= S.add(ptr);
                }

                assert(!S.empty());
            }
        }

        return changed;
    }